

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

void __thiscall xLearn::FromDMReader::Initialize(FromDMReader *this,DMatrix **dmatrix)

{
  undefined1 auVar1 [64];
  bool label;
  uint uVar2;
  DMatrix *pDVar3;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  pDVar3 = *dmatrix;
  this->data_ptr_ = pDVar3;
  label = pDVar3->has_label;
  (this->super_Reader).has_label_ = label;
  uVar2 = pDVar3->row_length;
  this->num_samples_ = uVar2;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar2,label);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar4 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    auVar7 = vpbroadcastq_avx512f();
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = vpmovsxbd_avx512f(_DAT_0015b560);
    uVar6 = 0;
    auVar11 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      vpcmpuq_avx512f(auVar9,auVar7,2);
      vpcmpuq_avx512f(auVar8,auVar7,2);
      auVar1 = vmovdqu32_avx512f(auVar10);
      *(undefined1 (*) [64])(puVar4 + uVar6) = auVar1;
      uVar6 = uVar6 + 0x10;
      auVar9 = vpaddq_avx512f(auVar9,auVar11);
      auVar8 = vpaddq_avx512f(auVar8,auVar11);
      auVar10 = vpaddd_avx512f(auVar10,auVar12);
    } while ((lVar5 + (ulong)(lVar5 == 0) + 0xf & 0xfffffffffffffff0) != uVar6);
  }
  return;
}

Assistant:

void FromDMReader::Initialize(xLearn::DMatrix* &dmatrix) { 
  this->data_ptr_ = dmatrix;
  has_label_ = this->data_ptr_->has_label;
  num_samples_ = this->data_ptr_->row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}